

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O0

void __thiscall Reset_resetSetTestValueId_Test::TestBody(Reset_resetSetTestValueId_Test *this)

{
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  AssertHelper local_d8 [8];
  Message local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  string local_90 [32];
  AssertHelper local_70 [8];
  Message local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  ResetPtr r;
  Reset_resetSetTestValueId_Test *this_local;
  
  libcellml::Reset::create();
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Reset::testValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_30,"\"\"","r->testValueId()",(char (*) [1])0x11dbcd,&local_50)
  ;
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0x274,pcVar2);
    testing::internal::AssertHelper::operator=(local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  peVar3 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"id1",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  libcellml::Reset::setTestValueId((string *)peVar3);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Reset::testValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_a8,"\"id1\"","r->testValueId()",(char (*) [4])"id1",&local_c8)
  ;
  std::__cxx11::string::~string((string *)&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0x278,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)&gtest_ar.message_)
  ;
  return;
}

Assistant:

TEST(Reset, resetSetTestValueId)
{
    libcellml::ResetPtr r = libcellml::Reset::create();

    EXPECT_EQ("", r->testValueId());

    r->setTestValueId("id1");

    EXPECT_EQ("id1", r->testValueId());
}